

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH)

{
  uint uVar1;
  int local_20;
  uint idx;
  int ofs;
  int symbol;
  huff_tables *pH_local;
  jpeg_decoder *this_local;
  
  if (pH == (huff_tables *)0x0) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  idx = pH->look_up[this->m_bit_buf >> 0x18];
  if ((int)idx < 0) {
    local_20 = 0x17;
    do {
      uVar1 = -(idx + (this->m_bit_buf >> ((byte)local_20 & 0x1f) & 1));
      if ((0x1ff < uVar1) || (local_20 < 0)) {
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      idx = pH->tree[uVar1];
      local_20 = local_20 + -1;
    } while ((int)idx < 0);
    get_bits_no_markers(this,0x1f - local_20);
  }
  else {
    if (0xff < (int)idx) {
      __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
    }
    get_bits_no_markers(this,(uint)pH->code_size[(int)idx]);
  }
  return idx;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH)
	{
		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		int symbol;
		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up[m_bit_buf >> 24]) < 0)
		{
			// Decode more bits, use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));
		}
		else
		{
			assert(symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			get_bits_no_markers(pH->code_size[symbol]);
		}

		return symbol;
	}